

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O1

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CCompoundStm *statement)

{
  IStatement *pIVar1;
  ISubtreeWrapper *pIVar2;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> _Var3;
  CSeqStatement *this_00;
  ISubtreeWrapper *pIVar4;
  ISubtreeWrapper *pIVar5;
  CExpStatement *this_01;
  CConstExpression *this_02;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_40;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_38;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_30;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CCompound\n",0x17);
  pIVar1 = (statement->leftStatement)._M_t.
           super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
           super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
           super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
  if (pIVar1 == (IStatement *)0x0) {
    pIVar5 = (ISubtreeWrapper *)operator_new(0x10);
    this_01 = (CExpStatement *)operator_new(0x10);
    this_02 = (CConstExpression *)operator_new(0x10);
    IRT::CConstExpression::CConstExpression(this_02,0);
    local_30._M_head_impl = (CExpression *)this_02;
    IRT::CExpStatement::CExpStatement
              (this_01,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        *)&local_30);
    pIVar5->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_001834e0;
    pIVar5[1]._vptr_ISubtreeWrapper = (_func_int **)this_01;
    pIVar2 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    (this->wrapper)._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar5;
    if (pIVar2 != (ISubtreeWrapper *)0x0) {
      operator_delete(pIVar2);
    }
    if ((CConstExpression *)local_30._M_head_impl != (CConstExpression *)0x0) {
      (*(((CExpression *)&(local_30._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
  }
  else {
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    pIVar2 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    (this->wrapper)._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
    pIVar1 = (statement->rightStatement)._M_t.
             super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
             super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
             super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
    (*(code *)*(pIVar1->super_PositionedNode).super_INode._vptr_INode)(pIVar1,this);
    pIVar5 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    if (pIVar5 == (ISubtreeWrapper *)0x0) {
      pIVar4 = (ISubtreeWrapper *)operator_new(0x10);
      (*pIVar2->_vptr_ISubtreeWrapper[1])(&local_40,pIVar2);
      _Var3._M_head_impl = local_40._M_head_impl;
      local_40._M_head_impl = (CStatement *)0x0;
      pIVar4->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_001834e0;
      pIVar4[1]._vptr_ISubtreeWrapper = (_func_int **)_Var3._M_head_impl;
      pIVar5 = (this->wrapper)._M_t.
               super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
               ._M_t.
               super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
               .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
      (this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar4;
      if (pIVar5 != (ISubtreeWrapper *)0x0) {
        operator_delete(pIVar5);
      }
      if (local_40._M_head_impl != (CStatement *)0x0) {
        (*((local_40._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
    }
    else {
      (*pIVar5->_vptr_ISubtreeWrapper[1])(&local_40);
      _Var3._M_head_impl = local_40._M_head_impl;
      this_00 = (CSeqStatement *)operator_new(0x18);
      (*pIVar2->_vptr_ISubtreeWrapper[1])(&local_40,pIVar2);
      local_28._M_head_impl = local_40._M_head_impl;
      local_40._M_head_impl = (CStatement *)0x0;
      local_38._M_head_impl = _Var3._M_head_impl;
      IRT::CSeqStatement::CSeqStatement
                (this_00,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                          *)&local_28,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_38);
      if (local_38._M_head_impl != (CStatement *)0x0) {
        (*((local_38._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
      local_38._M_head_impl = (CStatement *)0x0;
      if (local_28._M_head_impl != (CStatement *)0x0) {
        (*((local_28._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
      local_28._M_head_impl = (CStatement *)0x0;
      if (local_40._M_head_impl != (CStatement *)0x0) {
        (*((local_40._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
      pIVar4 = (ISubtreeWrapper *)operator_new(0x10);
      pIVar4->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_001834e0;
      pIVar4[1]._vptr_ISubtreeWrapper = (_func_int **)this_00;
      pIVar5 = (this->wrapper)._M_t.
               super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
               ._M_t.
               super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
               .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
      (this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar4;
      if (pIVar5 != (ISubtreeWrapper *)0x0) {
        operator_delete(pIVar5);
      }
    }
    if (pIVar2 != (ISubtreeWrapper *)0x0) {
      operator_delete(pIVar2);
    }
  }
  return;
}

Assistant:

void CBuildVisitor::Visit( CCompoundStm &statement ) {
    std::cout << "IRT builder: CCompound\n";
    if ( statement.leftStatement == NULL ) {
        // fake statement
        updateSubtreeWrapper( new IRT::CStatementWrapper( std::move( std::unique_ptr<const IRT::CStatement>(
                new IRT::CExpStatement(
                        std::move( std::unique_ptr<const IRT::CExpression>( new IRT::CConstExpression( 0 )))
                )
        ))));
    } else {
        statement.leftStatement->Accept( *this );
        auto leftStatement = std::move( wrapper );
        statement.rightStatement->Accept( *this );

        if ( wrapper ) {
            std::unique_ptr<const IRT::CStatement> rightStatement = std::move( wrapper->ToStatement( ));
            std::unique_ptr<const IRT::CStatement> compound = std::move( std::unique_ptr<const IRT::CStatement>(
                    new IRT::CSeqStatement( std::move( leftStatement->ToStatement( )), std::move( rightStatement ))));
            updateSubtreeWrapper( new IRT::CStatementWrapper( std::move( compound )));
        } else {
            updateSubtreeWrapper( new IRT::CStatementWrapper( std::move( leftStatement->ToStatement( ))));
        }
    }
}